

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *pack_context_opaque)

{
  ushort uVar1;
  uint num_rects;
  uint uVar2;
  CustomRect *pCVar3;
  stbrp_rect *rects;
  long lVar4;
  char *__function;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ImVector<stbrp_rect> pack_rects;
  
  num_rects = (atlas->CustomRects).Size;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x78d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  uVar7 = 8;
  if (8 < num_rects) {
    uVar7 = (ulong)num_rects;
  }
  rects = (stbrp_rect *)ImGui::MemAlloc(uVar7 << 4);
  memset(rects,0,(long)(atlas->CustomRects).Size << 4);
  lVar4 = (long)(atlas->CustomRects).Size;
  if (0 < lVar4) {
    pCVar3 = (atlas->CustomRects).Data;
    lVar6 = 0;
    do {
      if ((ulong)num_rects << 4 == lVar6) {
        __function = "value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
        goto LAB_00195e34;
      }
      *(undefined4 *)((long)&rects->w + lVar6) = *(undefined4 *)(&pCVar3->Width + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar4 * 0x10 != lVar6);
  }
  stbrp_pack_rects((stbrp_context *)pack_context_opaque,rects,num_rects);
  lVar4 = 4;
  uVar7 = 0;
  do {
    if (*(int *)((long)&rects->x + lVar4) != 0) {
      if ((long)(atlas->CustomRects).Size <= (long)uVar7) {
        __function = 
        "value_type &ImVector<ImFontAtlas::CustomRect>::operator[](int) [T = ImFontAtlas::CustomRect]"
        ;
LAB_00195e34:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,__function);
      }
      pCVar3 = (atlas->CustomRects).Data;
      uVar2 = *(uint *)((long)&rects->w + lVar4);
      *(uint *)((long)&pCVar3->ID + lVar4 * 2) = uVar2;
      if ((*(short *)((long)&rects->id + lVar4) != *(short *)((long)pCVar3 + lVar4 * 2 + -4)) ||
         (uVar1 = *(ushort *)((long)&rects->id + lVar4 + 2),
         uVar1 != *(ushort *)((long)pCVar3 + lVar4 * 2 + -2))) {
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0x79d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      iVar5 = (uint)uVar1 + (uVar2 >> 0x10);
      if (iVar5 < atlas->TexHeight) {
        iVar5 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar5;
    }
    uVar7 = uVar7 + 1;
    lVar4 = lVar4 + 0x10;
    if (num_rects == uVar7) {
      ImGui::MemFree(rects);
      return;
    }
  } while( true );
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* pack_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)pack_context_opaque;

    ImVector<ImFontAtlas::CustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, sizeof(stbrp_rect) * user_rects.Size);
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}